

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

void __thiscall
cfd::core::TaprootScriptTree::TaprootScriptTree
          (TaprootScriptTree *this,uint8_t leaf_version,Script *script,NetType network_type)

{
  undefined1 uVar1;
  undefined8 uVar2;
  undefined7 in_stack_ffffffffffffff70;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *this_00;
  CfdError error_code;
  allocator local_71;
  string local_70 [32];
  CfdSourceLocation local_50;
  NetType local_24;
  Script *pSStack_20;
  NetType network_type_local;
  Script *script_local;
  TaprootScriptTree *pTStack_10;
  uint8_t leaf_version_local;
  TaprootScriptTree *this_local;
  
  local_24 = network_type;
  pSStack_20 = script;
  script_local._7_1_ = leaf_version;
  pTStack_10 = this;
  TapBranch::TapBranch(&this->super_TapBranch,network_type);
  (this->super_TapBranch)._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00b63b88;
  this_00 = &this->nodes_;
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector(this_00);
  error_code = (CfdError)((ulong)this_00 >> 0x20);
  (this->super_TapBranch).has_leaf_ = true;
  (this->super_TapBranch).leaf_version_ = script_local._7_1_;
  if ((((this->super_TapBranch).is_elements_ & 1U) != 0) &&
     ((this->super_TapBranch).leaf_version_ == 0xc0)) {
    (this->super_TapBranch).leaf_version_ = 0xc4;
  }
  Script::operator=(&(this->super_TapBranch).script_,pSStack_20);
  uVar1 = TaprootUtil::IsValidLeafVersion(script_local._7_1_);
  if (!(bool)uVar1) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_taproot.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0x21b;
    local_50.funcname = "TaprootScriptTree";
    logger::warn<unsigned_char&>
              (&local_50,"Unsupported leaf version. [{}]",(uchar *)((long)&script_local + 7));
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_70,"Unsupported leaf version.",&local_71);
    CfdException::CfdException
              ((CfdException *)this,error_code,(string *)CONCAT17(uVar1,in_stack_ffffffffffffff70));
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return;
}

Assistant:

TaprootScriptTree::TaprootScriptTree(
    uint8_t leaf_version, const Script& script, NetType network_type)
    : TapBranch(network_type) {
  has_leaf_ = true;
  leaf_version_ = leaf_version;
  if (is_elements_ && (leaf_version_ == kTapScriptLeafVersion)) {
    leaf_version_ = kElementsTapScriptLeafVersion;
  }
  script_ = script;
  if (!TaprootUtil::IsValidLeafVersion(leaf_version)) {
    warn(CFD_LOG_SOURCE, "Unsupported leaf version. [{}]", leaf_version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unsupported leaf version.");
  }
}